

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlSavePattern1(Ssw_Man_t *p,int fInit)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  int local_28;
  int nTruePis;
  int k;
  int i;
  Aig_Obj_t *pObj;
  int fInit_local;
  Ssw_Man_t *p_local;
  
  memset(p->pPatWords,0xff,(long)p->nPatWords << 2);
  if (fInit != 0) {
    iVar1 = Saig_ManPiNum(p->pAig);
    local_28 = 0;
    for (nTruePis = 0; iVar2 = Saig_ManRegNum(p->pAig), nTruePis < iVar2; nTruePis = nTruePis + 1) {
      p_00 = p->pAig->vCis;
      iVar2 = Saig_ManPiNum(p->pAig);
      Vec_PtrEntry(p_00,nTruePis + iVar2);
      Abc_InfoXorBit(p->pPatWords,iVar1 * p->nFrames + local_28);
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void Ssw_SmlSavePattern1( Ssw_Man_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i, k, nTruePis;
    memset( p->pPatWords, 0xff, sizeof(unsigned) * p->nPatWords );
    if ( !fInit )
        return;
    // clear the state bits to correspond to all-0 initial state
    nTruePis = Saig_ManPiNum(p->pAig);
    k = 0;
    Saig_ManForEachLo( p->pAig, pObj, i )
        Abc_InfoXorBit( p->pPatWords, nTruePis * p->nFrames + k++ );
}